

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::refreshMultiLine(Cmd *this,State *state)

{
  ulong uVar1;
  string_view str;
  char cVar2;
  int plen_00;
  int iVar3;
  long lVar4;
  long lVar5;
  int col;
  int rpos2;
  int j;
  undefined1 local_88 [8];
  string ab;
  int old_rows;
  int rpos;
  int rows;
  int plen;
  char seq [64];
  State *state_local;
  Cmd *this_local;
  
  seq._56_8_ = state;
  plen_00 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  old_rows = (int)(((plen_00 + lVar4 + *(long *)(seq._56_8_ + 0x30)) - 1U) /
                  *(ulong *)(seq._56_8_ + 0x30));
  ab.field_2._12_4_ =
       (undefined4)
       ((ulong)((long)plen_00 + *(long *)(seq._56_8_ + 0x28) + *(long *)(seq._56_8_ + 0x30)) /
       *(ulong *)(seq._56_8_ + 0x30));
  ab.field_2._8_4_ = (undefined4)*(undefined8 *)(seq._56_8_ + 0x38);
  std::__cxx11::string::string((string *)local_88);
  if ((int)*(undefined8 *)(seq._56_8_ + 0x38) < old_rows) {
    *(long *)(seq._56_8_ + 0x38) = (long)old_rows;
  }
  if (0 < (int)(ab.field_2._8_4_ - ab.field_2._12_4_)) {
    snprintf((char *)&rows,0x40,"\x1b[%dB",(ulong)(uint)(ab.field_2._8_4_ - ab.field_2._12_4_));
    std::__cxx11::string::append(local_88);
  }
  for (col = 0; col < ab.field_2._8_4_ + -1; col = col + 1) {
    std::__cxx11::string::append(local_88);
  }
  std::__cxx11::string::append(local_88);
  std::__cxx11::string::append((string *)local_88);
  if ((*(byte *)(seq._56_8_ + 0x48) & 1) == 0) {
    std::__cxx11::string::append((string *)local_88);
  }
  else {
    cVar2 = std::__cxx11::string::size();
    std::__cxx11::string::append((ulong)local_88,cVar2);
  }
  refreshShowHints(this,(string *)local_88,(State *)seq._56_8_,plen_00);
  if (((*(long *)(seq._56_8_ + 0x20) != 0) &&
      (lVar4 = *(long *)(seq._56_8_ + 0x20), lVar5 = std::__cxx11::string::size(), lVar4 == lVar5))
     && ((ulong)(*(long *)(seq._56_8_ + 0x20) + (long)plen_00) % *(ulong *)(seq._56_8_ + 0x30) == 0)
     ) {
    std::__cxx11::string::append(local_88);
    old_rows = old_rows + 1;
    if ((int)*(undefined8 *)(seq._56_8_ + 0x38) < old_rows) {
      *(long *)(seq._56_8_ + 0x38) = (long)old_rows;
    }
  }
  iVar3 = (int)((ulong)((long)plen_00 + *(long *)(seq._56_8_ + 0x20) + *(long *)(seq._56_8_ + 0x30))
               / *(ulong *)(seq._56_8_ + 0x30));
  if (0 < old_rows - iVar3) {
    snprintf((char *)&rows,0x40,"\x1b[%dA",(ulong)(uint)(old_rows - iVar3));
    std::__cxx11::string::append(local_88);
  }
  uVar1 = (ulong)((long)plen_00 + *(long *)(seq._56_8_ + 0x20)) % *(ulong *)(seq._56_8_ + 0x30);
  if ((int)uVar1 == 0) {
    std::__cxx11::string::append(local_88);
  }
  else {
    snprintf((char *)&rows,0x40,"\r\x1b[%dC",uVar1 & 0xffffffff);
    std::__cxx11::string::append(local_88);
  }
  *(undefined8 *)(seq._56_8_ + 0x28) = *(undefined8 *)(seq._56_8_ + 0x20);
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
  write_string(this,str);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void refreshMultiLine(State *state) {
		char seq[64];
		const int plen     = prompt.size();
		int rows           = (plen + state->buf.size() + state->cols - 1) / state->cols; // rows used by current buf.
		const int rpos     = (plen + state->oldpos + state->cols) / state->cols;         // cursor relative row.
		const int old_rows = state->maxrows;
		std::string ab;

		// Update maxrows if needed.
		if (rows > static_cast<int>(state->maxrows)) {
			state->maxrows = rows;
		}

		// First step: clear all the lines used before. To do so start by going to the last row.
		if (old_rows - rpos > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dB", old_rows - rpos);
			ab.append(seq);
		}

		// Now for every row clear it, go up.
		for (int j = 0; j < old_rows - 1; j++) {
			ab.append("\r\x1b[0K\x1b[1A");
		}

		// Clean the top line.
		ab.append("\r\x1b[0K");

		// Write the prompt and the current buffer content
		ab.append(prompt);
		if (state->mask_mode) {
			ab.append(state->buf.size(), '*');
		} else {
			ab.append(state->buf);
		}

		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// If we are at the very end of the screen with our prompt, we need to emit a newline and move the prompt to the first column.
		if (state->pos && state->pos == state->buf.size() && (state->pos + plen) % state->cols == 0) {
			ab.append("\n\r");
			rows++;
			if (rows > static_cast<int>(state->maxrows)) {
				state->maxrows = rows;
			}
		}

		// Move cursor to right position.
		int rpos2 = (plen + state->pos + state->cols) / state->cols; // current cursor relative row.

		// Go up till we reach the expected positon.
		if (rows - rpos2 > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dA", rows - rpos2);
			ab.append(seq);
		}

		// Set column.
		const int col = (plen + state->pos) % state->cols;
		if (col) {
			snprintf(seq, sizeof(seq), "\r\x1b[%dC", col);
			ab.append(seq);
		} else {
			ab.append("\r");
		}

		state->oldpos = state->pos;

		write_string(ab);
	}